

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

void __thiscall
iDynTree::AttitudeQuaternionEKF::prepareSystemNoiseCovarianceMatrix
          (AttitudeQuaternionEKF *this,MatrixDynSize *Q)

{
  long lVar1;
  size_t sVar2;
  ulong in_RSI;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_> *in_RDI;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> Q_;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> Id3;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> U;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> F_u;
  Matrix6x6 U_dyn;
  MatrixDynSize Fu_dyn;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> *other;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  MatrixDynSize *this_01;
  MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *in_stack_fffffffffffffc48;
  MatrixFixSize<6U,_6U> *in_stack_fffffffffffffc50;
  MatrixDynSize *in_stack_fffffffffffffc58;
  double *in_stack_fffffffffffffc70;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc78;
  MatrixFixSize<6U,_6U> local_168;
  MatrixDynSize local_38 [40];
  ulong local_10;
  
  local_10 = in_RSI;
  lVar1 = iDynTree::MatrixDynSize::rows();
  if (lVar1 != *(long *)(in_RDI + 0x3d8)) {
    lVar1 = iDynTree::MatrixDynSize::cols();
    if (lVar1 != *(long *)(in_RDI + 0x3d8)) {
      iDynTree::MatrixDynSize::resize(local_10,*(ulong *)(in_RDI + 0x3d8));
    }
  }
  this_00 = *(Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> **)
             (in_RDI + 0x3d8);
  other = *(DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_> **
           )(in_RDI + 1000);
  sVar2 = VectorFixSize<3U>::size((VectorFixSize<3U> *)(in_RDI + 0x228));
  this_01 = local_38;
  iDynTree::MatrixDynSize::MatrixDynSize(this_01,(ulong)this_00,(ulong)(other + sVar2));
  iDynTree::MatrixDynSize::zero();
  MatrixFixSize<6U,_6U>::MatrixFixSize(&local_168);
  MatrixFixSize<6U,_6U>::zero(in_stack_fffffffffffffc50);
  toEigen(in_stack_fffffffffffffc58);
  toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffc48);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_fffffffffffffc48);
  toEigen(in_stack_fffffffffffffc58);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffc48,(Index)in_RDI,(Index)this_01);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_00,other);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffc48,(Index)in_RDI,(Index)this_01);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_00,other);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffc48,(Index)in_RDI,(Index)this_01);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_00,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
             *)other);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::block<3,3>
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffc48,(Index)in_RDI,(Index)this_01);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
             *)this_00,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
             *)other);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::operator*
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffc48,in_RDI);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  transpose((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
             *)this_01);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>>
  ::operator*(in_stack_fffffffffffffc48,
              (MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_RDI);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (this_00,(DenseBase<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                      *)other);
  iDynTree::MatrixDynSize::~MatrixDynSize(local_38);
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::prepareSystemNoiseCovarianceMatrix(iDynTree::MatrixDynSize &Q)
{
    using iDynTree::toEigen;

    if (Q.rows() != m_state_size && Q.cols() != m_state_size)
    {
        Q.resize(m_state_size, m_state_size);
    }


    iDynTree::MatrixDynSize Fu_dyn(m_state_size, m_input_size + m_state_qekf.m_gyroscope_bias.size());
    Fu_dyn.zero();
    iDynTree::Matrix6x6 U_dyn;
    U_dyn.zero();

    auto F_u(toEigen(Fu_dyn));
    auto U(toEigen(U_dyn));
    auto Id3(toEigen(m_Id3));
    auto Q_(toEigen(Q));

    F_u.block<3, 3>(4, 0) = Id3;
    F_u.block<3,3>(7, 3) = Id3;

    U.block<3, 3>(0, 0) = Id3*m_params_qekf.gyroscope_noise_variance;
    U.block<3, 3>(3, 3) = Id3*m_params_qekf.gyro_bias_noise_variance;

    Q_ = F_u*U*F_u.transpose();
}